

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int Boots_on(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  long oldprop;
  
  if (uarmf != (obj *)0x0) {
    uVar4 = u.uprops[objects[uarmf->otyp].oc_oprop].extrinsic & 0xffffffdf;
    Oprops_on(uarmf,0x20);
    switch(uarmf->otyp) {
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x9a:
      break;
    case 0x96:
      if ((uVar4 == 0) && ((u.uprops[0x1a].intrinsic & 0xffffff) == 0)) {
        discover_object((int)uarmf->otyp,'\x01','\x01');
        pcVar3 = "";
        if (u.uprops[0x1a].intrinsic != 0) {
          pcVar3 = " a bit more";
        }
        pline("You feel yourself speed up%s.",pcVar3);
      }
      break;
    case 0x97:
      if (((((byte)u._1052_1_ >> 1 & 1) != 0) ||
          (bVar1 = is_lava(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) ||
         (bVar1 = is_swamp(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) {
        spoteffects('\x01');
      }
      break;
    case 0x98:
      discover_object((int)uarmf->otyp,'\x01','\x01');
      pcVar3 = body_part(9);
      pcVar3 = makeplural(pcVar3);
      pline("Your %s feel longer.",pcVar3);
      break;
    case 0x99:
      if (((uVar4 == 0) && (u.uprops[0x13].intrinsic == 0)) && (u.uprops[0x13].blocked == 0)) {
        discover_object((int)uarmf->otyp,'\x01','\x01');
        pline("You walk very quietly.");
      }
      break;
    case 0x9b:
      if ((uVar4 == 0) && ((u.uprops[0x25].intrinsic & 0xff000000) == 0)) {
        iVar2 = rnd(0x14);
        incr_itimeout(&u.uprops[0x25].intrinsic,(long)iVar2);
      }
      break;
    case 0x9c:
      if ((uVar4 == 0) && (u.uprops[0x12].intrinsic == 0)) {
        discover_object((int)uarmf->otyp,'\x01','\x01');
        float_up();
        spoteffects('\0');
        if (uarmf == (obj *)0x0) {
          return 0;
        }
      }
      break;
    default:
      warning("Unknown type of %s (%d)","boots",(ulong)(uint)(int)uarmf->otyp);
    }
    if ((uarmf != (obj *)0x0) && (bVar1 = is_racial_armor(uarmf,&youmonst), bVar1 == '\0')) {
      u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
    }
    if (1 < moves) {
      discover_cursed_equip(uarmf);
    }
  }
  return 0;
}

Assistant:

static int Boots_on(void)
{
    long oldprop;

    if (!uarmf) return 0;

    oldprop = u.uprops[objects[uarmf->otyp].oc_oprop].extrinsic & ~WORN_BOOTS;

    Oprops_on(uarmf, WORN_BOOTS);

    switch(uarmf->otyp) {
	case LOW_BOOTS:
	case IRON_SHOES:
	case HIGH_BOOTS:
	case KICKING_BOOTS:
		break;
	case JUMPING_BOOTS:
        	/* jumping is obvious no matter what the situation */
        	makeknown(uarmf->otyp);
                pline("Your %s feel longer.", makeplural(body_part(LEG)));
                break;
	case WATER_WALKING_BOOTS:
		if (u.uinwater ||
		    is_lava(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy))
			spoteffects(TRUE);
		break;
	case SPEED_BOOTS:
		/* Speed boots are still better than intrinsic speed, */
		/* though not better than potion speed */
		if (!oldprop && !(HFast & TIMEOUT)) {
			makeknown(uarmf->otyp);
			pline("You feel yourself speed up%s.",
				(oldprop || HFast) ? " a bit more" : "");
		}
		break;
	case ELVEN_BOOTS:
		if (!oldprop && !HStealth && !BStealth) {
			makeknown(uarmf->otyp);
			pline("You walk very quietly.");
		}
		break;
	case FUMBLE_BOOTS:
		if (!oldprop && !(HFumbling & ~TIMEOUT))
			incr_itimeout(&HFumbling, rnd(20));
		break;
	case LEVITATION_BOOTS:
		if (!oldprop && !HLevitation) {
			makeknown(uarmf->otyp);
			float_up();
			spoteffects(FALSE); /* can unset uarmf */
			if (!uarmf) return 0;
		}
		break;
	default: warning(unknown_type, c_boots, uarmf->otyp);
    }

    if (uarmf && !is_racial_armor(uarmf, &youmonst))
	u.uconduct.unracearmor++;

    /* suppress message if called on first game turn via set_wear() */
    if (moves > 1)
	discover_cursed_equip(uarmf);

    return 0;
}